

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

void update_firstpass_stats
               (AV1_COMP *cpi,FRAME_STATS *stats,double raw_err_stdev,int frame_number,
               int64_t ts_duration,BLOCK_SIZE fp_block_size)

{
  long lVar1;
  void *__dest;
  int iVar2;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  BLOCK_SIZE in_R8B;
  double dVar3;
  FIRSTPASS_INFO *firstpass_info;
  aom_codec_pkt_list *pktlist;
  FIRSTPASS_STATS *stats_00;
  double min_err;
  int num_mbs;
  int num_mbs_16X16;
  FIRSTPASS_STATS fps;
  FIRSTPASS_STATS *this_frame_stats;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  TWO_PASS *twopass;
  FIRSTPASS_STATS *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int num_mbs_16X16_00;
  int iVar4;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  undefined8 local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  
  lVar1 = *in_RDI;
  __dest = *(void **)(*(long *)(lVar1 + 0x5d58) + 8);
  if ((char)in_RDI[0x8481] == '\0') {
    num_mbs_16X16_00 = (int)in_RDI[0x7832];
  }
  else {
    num_mbs_16X16_00 = *(int *)((long)in_RDI + 0x712fc);
  }
  iVar4 = num_mbs_16X16_00;
  iVar2 = get_num_mbs(in_R8B,num_mbs_16X16_00);
  dVar3 = sqrt((double)iVar2);
  firstpass_info = (FIRSTPASS_INFO *)(dVar3 * 200.0);
  local_130 = (double)in_RSI[0xd] * (double)in_RSI[0xe];
  local_138 = (double)in_EDX;
  local_118 = (double)(in_RSI[2] >> 8) + (double)firstpass_info;
  local_110 = (double)(in_RSI[3] >> 8) + (double)firstpass_info;
  local_128 = (double)(*in_RSI >> 8) + (double)firstpass_info;
  local_120 = (double)in_RSI[1];
  local_108 = (double)*(int *)((long)in_RSI + 0x24) / (double)iVar2;
  local_f8 = (double)(int)in_RSI[5] / (double)iVar2;
  local_f0 = (double)in_RSI[6] / (double)iVar2;
  local_e8 = (double)(int)in_RSI[7] / (double)iVar2;
  local_e0 = (double)*(int *)((long)in_RSI + 0x3c);
  local_d8 = 0;
  if ((int)in_RSI[4] < 1) {
    local_d0 = 0.0;
    local_c8 = 0.0;
    local_c0 = 0.0;
    pktlist = (aom_codec_pkt_list *)0x0;
    stats_00 = (FIRSTPASS_STATS *)0x0;
    local_100 = 0.0;
  }
  else {
    local_d0 = (double)(int)in_RSI[9] / (double)(int)in_RSI[4];
    local_c8 = (double)(int)in_RSI[10] / (double)(int)in_RSI[4];
    local_c0 = (double)*(int *)((long)in_RSI + 0x4c) / (double)(int)in_RSI[4];
    pktlist = (aom_codec_pkt_list *)((double)*(int *)((long)in_RSI + 0x54) / (double)(int)in_RSI[4])
    ;
    stats_00 = (FIRSTPASS_STATS *)
               (((double)in_RSI[0xb] -
                ((double)(int)in_RSI[9] * (double)(int)in_RSI[9]) / (double)(int)in_RSI[4]) /
               (double)(int)in_RSI[4]);
    local_100 = (double)(int)in_RSI[4] / (double)iVar2;
  }
  normalize_firstpass_stats
            ((FIRSTPASS_STATS *)CONCAT44(iVar4,iVar2),(double)firstpass_info,
             (double)CONCAT44(num_mbs_16X16_00,in_stack_fffffffffffffeb0),
             (double)in_stack_fffffffffffffea8);
  memcpy(__dest,&local_138,0xe8);
  if (*(int *)(*in_RDI + 0x5a88) == 0) {
    output_stats(stats_00,pktlist);
  }
  else {
    av1_firstpass_info_push
              (firstpass_info,
               (FIRSTPASS_STATS *)CONCAT44(num_mbs_16X16_00,in_stack_fffffffffffffeb0));
  }
  if (*(long *)(*(long *)(*in_RDI + 0x5d58) + 0x18) != 0) {
    av1_accumulate_stats
              ((FIRSTPASS_STATS *)CONCAT44(num_mbs_16X16_00,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8);
  }
  *(long *)(*(long *)(lVar1 + 0x5d58) + 8) = *(long *)(*(long *)(lVar1 + 0x5d58) + 8) + 0xe8;
  if ((((int)in_RDI[0x13acb] == 0) && ((int)in_RDI[0x84eb] == 1)) &&
     (*(ulong *)(*(long *)(lVar1 + 0x5d58) + 0x10) <= *(ulong *)(*(long *)(lVar1 + 0x5d58) + 8))) {
    *(undefined8 *)(*(long *)(lVar1 + 0x5d58) + 8) = **(undefined8 **)(lVar1 + 0x5d58);
  }
  return;
}

Assistant:

static void update_firstpass_stats(AV1_COMP *cpi,
                                   const FRAME_STATS *const stats,
                                   const double raw_err_stdev,
                                   const int frame_number,
                                   const int64_t ts_duration,
                                   const BLOCK_SIZE fp_block_size) {
  TWO_PASS *twopass = &cpi->ppi->twopass;
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  FIRSTPASS_STATS *this_frame_stats = twopass->stats_buf_ctx->stats_in_end;
  FIRSTPASS_STATS fps;
  // The minimum error here insures some bit allocation to frames even
  // in static regions. The allocation per MB declines for larger formats
  // where the typical "real" energy per MB also falls.
  // Initial estimate here uses sqrt(mbs) to define the min_err, where the
  // number of mbs is proportional to the image area.
  const int num_mbs_16X16 = (cpi->oxcf.resize_cfg.resize_mode != RESIZE_NONE)
                                ? cpi->initial_mbs
                                : mi_params->MBs;
  // Number of actual units used in the first pass, it can be other square
  // block sizes than 16X16.
  const int num_mbs = get_num_mbs(fp_block_size, num_mbs_16X16);
  const double min_err = 200 * sqrt(num_mbs);

  fps.weight = stats->intra_factor * stats->brightness_factor;
  fps.frame = frame_number;
  fps.coded_error = (double)(stats->coded_error >> 8) + min_err;
  fps.sr_coded_error = (double)(stats->sr_coded_error >> 8) + min_err;
  fps.intra_error = (double)(stats->intra_error >> 8) + min_err;
  fps.frame_avg_wavelet_energy = (double)stats->frame_avg_wavelet_energy;
  fps.count = 1.0;
  fps.pcnt_inter = (double)stats->inter_count / num_mbs;
  fps.pcnt_second_ref = (double)stats->second_ref_count / num_mbs;
  fps.pcnt_neutral = (double)stats->neutral_count / num_mbs;
  fps.intra_skip_pct = (double)stats->intra_skip_count / num_mbs;
  fps.inactive_zone_rows = (double)stats->image_data_start_row;
  fps.inactive_zone_cols = 0.0;  // Placeholder: not currently supported.
  fps.raw_error_stdev = raw_err_stdev;
  fps.is_flash = 0;
  fps.noise_var = 0.0;
  fps.cor_coeff = 1.0;
  fps.log_coded_error = 0.0;
  fps.log_intra_error = 0.0;

  if (stats->mv_count > 0) {
    fps.MVr = (double)stats->sum_mvr / stats->mv_count;
    fps.mvr_abs = (double)stats->sum_mvr_abs / stats->mv_count;
    fps.MVc = (double)stats->sum_mvc / stats->mv_count;
    fps.mvc_abs = (double)stats->sum_mvc_abs / stats->mv_count;
    fps.MVrv = ((double)stats->sum_mvrs -
                ((double)stats->sum_mvr * stats->sum_mvr / stats->mv_count)) /
               stats->mv_count;
    fps.MVcv = ((double)stats->sum_mvcs -
                ((double)stats->sum_mvc * stats->sum_mvc / stats->mv_count)) /
               stats->mv_count;
    fps.mv_in_out_count = (double)stats->sum_in_vectors / (stats->mv_count * 2);
    fps.new_mv_count = stats->new_mv_count;
    fps.pcnt_motion = (double)stats->mv_count / num_mbs;
  } else {
    fps.MVr = 0.0;
    fps.mvr_abs = 0.0;
    fps.MVc = 0.0;
    fps.mvc_abs = 0.0;
    fps.MVrv = 0.0;
    fps.MVcv = 0.0;
    fps.mv_in_out_count = 0.0;
    fps.new_mv_count = 0.0;
    fps.pcnt_motion = 0.0;
  }

  // TODO(paulwilkins):  Handle the case when duration is set to 0, or
  // something less than the full time between subsequent values of
  // cpi->source_time_stamp.
  fps.duration = (double)ts_duration;

  normalize_firstpass_stats(&fps, num_mbs_16X16, cm->width, cm->height);

  // We will store the stats inside the persistent twopass struct (and NOT the
  // local variable 'fps'), and then cpi->output_pkt_list will point to it.
  *this_frame_stats = fps;
  if (!cpi->ppi->lap_enabled) {
    output_stats(this_frame_stats, cpi->ppi->output_pkt_list);
  } else {
    av1_firstpass_info_push(&twopass->firstpass_info, this_frame_stats);
  }
  if (cpi->ppi->twopass.stats_buf_ctx->total_stats != NULL) {
    av1_accumulate_stats(cpi->ppi->twopass.stats_buf_ctx->total_stats, &fps);
  }
  twopass->stats_buf_ctx->stats_in_end++;
  // When ducky encode is on, we always use linear buffer for stats_buf_ctx.
  if (cpi->use_ducky_encode == 0) {
    // TODO(angiebird): Figure out why first pass uses circular buffer.
    /* In the case of two pass, first pass uses it as a circular buffer,
     * when LAP is enabled it is used as a linear buffer*/
    if ((cpi->oxcf.pass == AOM_RC_FIRST_PASS) &&
        (twopass->stats_buf_ctx->stats_in_end >=
         twopass->stats_buf_ctx->stats_in_buf_end)) {
      twopass->stats_buf_ctx->stats_in_end =
          twopass->stats_buf_ctx->stats_in_start;
    }
  }
}